

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wavelib.c
# Opt level: O0

wt_object wt_init(wave_object wave,char *method,int siglength,int J)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  wt_object local_38;
  wt_object obj;
  int local_28;
  int MaxIter;
  int i;
  int size;
  int J_local;
  int siglength_local;
  char *method_local;
  wave_object wave_local;
  
  local_38 = (wt_object)0x0;
  iVar3 = wave->filtlength;
  if (100 < J) {
    printf("\n The Decomposition Iterations Cannot Exceed 100. Exiting \n");
    exit(-1);
  }
  uVar1 = wmaxiter(siglength);
  if (J <= (int)uVar1) {
    if (method == (char *)0x0) {
      local_38 = (wt_object)malloc((long)(siglength + J * 2 * (iVar3 + 1)) * 8 + 0x1f8);
      local_38->outlength = siglength + J * 2 * (iVar3 + 1);
      strcpy(local_38->ext,"sym");
    }
    else {
      iVar2 = strcmp(method,"dwt");
      if ((iVar2 == 0) || (iVar2 = strcmp(method,"DWT"), iVar2 == 0)) {
        local_38 = (wt_object)malloc((long)(siglength + J * 2 * (iVar3 + 1)) * 8 + 0x1f8);
        local_38->outlength = siglength + J * 2 * (iVar3 + 1);
        strcpy(local_38->ext,"sym");
      }
      else {
        iVar2 = strcmp(method,"swt");
        if ((iVar2 == 0) || (iVar2 = strcmp(method,"SWT"), iVar2 == 0)) {
          iVar2 = testSWTlength(siglength,J);
          if (iVar2 == 0) {
            printf("\n For SWT the signal length must be a multiple of 2^J. \n");
            exit(-1);
          }
          local_38 = (wt_object)malloc((long)(siglength * (J + 1)) * 8 + 0x1f8);
          local_38->outlength = siglength * (J + 1);
          strcpy(local_38->ext,"per");
        }
        else {
          iVar2 = strcmp(method,"modwt");
          if ((iVar2 == 0) || (iVar2 = strcmp(method,"MODWT"), iVar2 == 0)) {
            pcVar4 = strstr(wave->wname,"haar");
            if ((pcVar4 == (char *)0x0) &&
               (((pcVar4 = strstr(wave->wname,"db"), pcVar4 == (char *)0x0 &&
                 (pcVar4 = strstr(wave->wname,"sym"), pcVar4 == (char *)0x0)) &&
                (pcVar4 = strstr(wave->wname,"coif"), pcVar4 == (char *)0x0)))) {
              printf(
                    "\n MODWT is only implemented for orthogonal wavelet families - db, sym and coif \n"
                    );
              exit(-1);
            }
            local_38 = (wt_object)malloc((long)(siglength * 2 * (J + 1)) * 8 + 0x1f8);
            local_38->outlength = siglength * (J + 1);
            strcpy(local_38->ext,"per");
          }
        }
      }
    }
    local_38->wave = wave;
    local_38->siglength = siglength;
    local_38->modwtsiglength = siglength;
    local_38->J = J;
    local_38->MaxIter = uVar1;
    strcpy(local_38->method,method);
    if (siglength % 2 == 0) {
      local_38->even = 1;
    }
    else {
      local_38->even = 0;
    }
    local_38->cobj = (conv_object)0x0;
    strcpy(local_38->cmethod,"direct");
    local_38->cfftset = 0;
    local_38->lenlength = J + 2;
    local_38->output = (double *)(local_38 + 1);
    iVar2 = strcmp(method,"dwt");
    if ((iVar2 == 0) || (iVar2 = strcmp(method,"DWT"), iVar2 == 0)) {
      for (local_28 = 0; local_28 < siglength + J * 2 * (iVar3 + 1); local_28 = local_28 + 1) {
        pcVar4 = local_38[1].method + (long)local_28 * 8 + -0x10;
        pcVar4[0] = '\0';
        pcVar4[1] = '\0';
        pcVar4[2] = '\0';
        pcVar4[3] = '\0';
        pcVar4[4] = '\0';
        pcVar4[5] = '\0';
        pcVar4[6] = '\0';
        pcVar4[7] = '\0';
      }
    }
    else {
      iVar3 = strcmp(method,"swt");
      if ((iVar3 == 0) || (iVar3 = strcmp(method,"SWT"), iVar3 == 0)) {
        for (local_28 = 0; local_28 < siglength * (J + 1); local_28 = local_28 + 1) {
          pcVar4 = local_38[1].method + (long)local_28 * 8 + -0x10;
          pcVar4[0] = '\0';
          pcVar4[1] = '\0';
          pcVar4[2] = '\0';
          pcVar4[3] = '\0';
          pcVar4[4] = '\0';
          pcVar4[5] = '\0';
          pcVar4[6] = '\0';
          pcVar4[7] = '\0';
        }
      }
      else {
        iVar3 = strcmp(method,"modwt");
        if ((iVar3 == 0) || (iVar3 = strcmp(method,"MODWT"), iVar3 == 0)) {
          for (local_28 = 0; local_28 < siglength * 2 * (J + 1); local_28 = local_28 + 1) {
            pcVar4 = local_38[1].method + (long)local_28 * 8 + -0x10;
            pcVar4[0] = '\0';
            pcVar4[1] = '\0';
            pcVar4[2] = '\0';
            pcVar4[3] = '\0';
            pcVar4[4] = '\0';
            pcVar4[5] = '\0';
            pcVar4[6] = '\0';
            pcVar4[7] = '\0';
          }
        }
      }
    }
    return local_38;
  }
  printf("\n Error - The Signal Can only be iterated %d times using this wavelet. Exiting\n",
         (ulong)uVar1);
  exit(-1);
}

Assistant:

wt_object wt_init(wave_object wave,const char* method, int siglength,int J) {
	int size,i,MaxIter;
	wt_object obj = NULL;

	size = wave->filtlength;

	if (J > 100) {
		printf("\n The Decomposition Iterations Cannot Exceed 100. Exiting \n");
		exit(-1);
	}

	MaxIter = wmaxiter(siglength);

	if (J > MaxIter) {
		printf("\n Error - The Signal Can only be iterated %d times using this wavelet. Exiting\n",MaxIter);
		exit(-1);
	}

	if (method == NULL) {
		obj = (wt_object)malloc(sizeof(struct wt_set) + sizeof(double)* (siglength +  2 * J * (size+1)));
		obj->outlength = siglength + 2 * J * (size + 1); // Default
		strcpy(obj->ext, "sym"); // Default
	}
	else if (!strcmp(method, "dwt") || !strcmp(method, "DWT")) {
		obj = (wt_object)malloc(sizeof(struct wt_set) + sizeof(double)* (siglength + 2 * J * (size + 1)));
		obj->outlength = siglength + 2 * J * (size + 1); // Default
		strcpy(obj->ext, "sym"); // Default
	}
	else if (!strcmp(method, "swt") || !strcmp(method, "SWT")) {
		if (!testSWTlength(siglength, J)) {
			printf("\n For SWT the signal length must be a multiple of 2^J. \n");
			exit(-1);
		}

		obj = (wt_object)malloc(sizeof(struct wt_set) + sizeof(double)* (siglength * (J + 1)));
		obj->outlength = siglength * (J + 1); // Default
		strcpy(obj->ext, "per"); // Default
	}
	else if (!strcmp(method, "modwt") || !strcmp(method, "MODWT")) {

		if (!strstr(wave->wname,"haar")) {
			if (!strstr(wave->wname,"db")) {
				if (!strstr(wave->wname, "sym")) {
					if (!strstr(wave->wname, "coif")) {
						printf("\n MODWT is only implemented for orthogonal wavelet families - db, sym and coif \n");
						exit(-1);
					}
				}
			}
		}

		obj = (wt_object)malloc(sizeof(struct wt_set) + sizeof(double)* (siglength * 2 * (J + 1)));
		obj->outlength = siglength * (J + 1); // Default
		strcpy(obj->ext, "per"); // Default
	}

	obj->wave = wave;
	obj->siglength = siglength;
	obj->modwtsiglength = siglength;
	obj->J = J;
	obj->MaxIter = MaxIter;
	strcpy(obj->method, method);

	if (siglength % 2 == 0) {
		obj->even = 1;
	}
	else {
		obj->even = 0;
	}

	obj->cobj = NULL;

	strcpy(obj->cmethod, "direct"); // Default
	obj->cfftset = 0;
	obj->lenlength = J + 2;
	obj->output = &obj->params[0];
	if (!strcmp(method, "dwt") || !strcmp(method, "DWT")) {
		for (i = 0; i < siglength + 2 * J * (size + 1); ++i) {
			obj->params[i] = 0.0;
		}
	}
	else if (!strcmp(method, "swt") || !strcmp(method, "SWT")) {
		for (i = 0; i < siglength * (J + 1); ++i) {
			obj->params[i] = 0.0;
		}
	}
	else if (!strcmp(method, "modwt") || !strcmp(method, "MODWT")) {
		for (i = 0; i < siglength * 2 * (J + 1); ++i) {
			obj->params[i] = 0.0;
		}
	}
	//wave_summary(obj->wave);

	return obj;
}